

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDistribution.h
# Opt level: O3

void __thiscall chrono::ChZhangDistribution::~ChZhangDistribution(ChZhangDistribution *this)

{
  operator_delete(this,0x18);
  return;
}

Assistant:

class ChApi ChZhangDistribution : public ChDistribution {
  public:
    /// Create the Zhang distribution with average part. size
    /// and minimum particle size. Usually average:minimum = 3.25:1
    ChZhangDistribution(double average_size, double minimum_size);

    /// Compute a random value whose probability density is the Weibull distribution.
    /// It uses the "Smirnov transform" (inverse probability integral transform)
    virtual double GetRandom() override;

    double GetMinSize() const { return minsize; }
    double GetAverageSize() const { return (minsize + (1.0 / lambdar)); }

  private:
    double minsize;
    double lambdar;
}